

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerGLSL::emit_block_instructions(CompilerGLSL *this,SPIRBlock *block)

{
  Phi *pPVar1;
  int iVar2;
  uint32_t uVar3;
  iterator iVar4;
  size_t sVar5;
  TemporaryCopy TVar6;
  Instruction *op;
  Instruction *instruction;
  long lVar7;
  key_type local_90 [4];
  SmallVector<unsigned_int,_8UL> local_80;
  TemporaryCopy local_48;
  SPIRBlock *local_40;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_38;
  
  this->current_emitting_block = block;
  if (((this->backend).requires_relaxed_precision_analysis == true) &&
     (local_48 = (TemporaryCopy)
                 (block->phi_variables).super_VectorView<spirv_cross::SPIRBlock::Phi>.buffer_size,
     local_48 != (TemporaryCopy)0x0)) {
    local_38 = &(this->temporary_to_mirror_precision_alias)._M_h;
    lVar7 = 8;
    TVar6.dst_id = 0;
    TVar6.src_id = 0;
    local_40 = block;
    do {
      pPVar1 = (block->phi_variables).super_VectorView<spirv_cross::SPIRBlock::Phi>.ptr;
      if (TVar6 == (TemporaryCopy)0x0) {
        iVar2 = *(int *)((long)&(pPVar1->local_variable).id + lVar7);
LAB_0020cbb0:
        local_90[0] = iVar2;
        iVar4 = ::std::
                _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(local_38,local_90);
        if (iVar4.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
            _M_cur != (__node_type *)0x0) {
          local_80.super_VectorView<unsigned_int>.buffer_size = 0;
          local_80.buffer_capacity = 8;
          local_90[0] = 0x53;
          local_90[1] = 0;
          local_90[2] = 3;
          local_80.super_VectorView<unsigned_int>.ptr = (uint *)&local_80.stack_storage;
          uVar3 = Compiler::expression_type_id
                            (&this->super_Compiler,
                             *(uint32_t *)
                              ((long)iVar4.
                                     super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                     ._M_cur + 8));
          SmallVector<unsigned_int,_8UL>::reserve
                    (&local_80,local_80.super_VectorView<unsigned_int>.buffer_size + 1);
          *(uint32_t *)
           ((char *)local_80.super_VectorView<unsigned_int>.ptr +
           local_80.super_VectorView<unsigned_int>.buffer_size * 4) = uVar3;
          sVar5 = local_80.super_VectorView<unsigned_int>.buffer_size + 2;
          local_80.super_VectorView<unsigned_int>.buffer_size =
               local_80.super_VectorView<unsigned_int>.buffer_size + 1;
          SmallVector<unsigned_int,_8UL>::reserve(&local_80,sVar5);
          *(undefined4 *)
           ((char *)local_80.super_VectorView<unsigned_int>.ptr +
           local_80.super_VectorView<unsigned_int>.buffer_size * 4) =
               *(undefined4 *)
                ((long)iVar4.
                       super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                       ._M_cur + 0xc);
          sVar5 = local_80.super_VectorView<unsigned_int>.buffer_size + 2;
          local_80.super_VectorView<unsigned_int>.buffer_size =
               local_80.super_VectorView<unsigned_int>.buffer_size + 1;
          SmallVector<unsigned_int,_8UL>::reserve(&local_80,sVar5);
          *(undefined4 *)
           ((char *)local_80.super_VectorView<unsigned_int>.ptr +
           local_80.super_VectorView<unsigned_int>.buffer_size * 4) =
               *(undefined4 *)
                ((long)iVar4.
                       super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                       ._M_cur + 8);
          local_80.super_VectorView<unsigned_int>.buffer_size =
               local_80.super_VectorView<unsigned_int>.buffer_size + 1;
          (*(this->super_Compiler)._vptr_Compiler[8])(this,local_90);
          local_80.super_VectorView<unsigned_int>.buffer_size = 0;
          block = local_40;
          if ((AlignedBuffer<unsigned_int,_8UL> *)local_80.super_VectorView<unsigned_int>.ptr !=
              &local_80.stack_storage) {
            free(local_80.super_VectorView<unsigned_int>.ptr);
            block = local_40;
          }
        }
      }
      else {
        iVar2 = *(int *)((long)&(pPVar1->local_variable).id + lVar7);
        if (*(int *)((long)&pPVar1[-1].local_variable.id + lVar7) != iVar2) goto LAB_0020cbb0;
      }
      TVar6 = (TemporaryCopy)((long)TVar6 + 1);
      lVar7 = lVar7 + 0xc;
    } while (local_48 != TVar6);
  }
  sVar5 = (block->ops).super_VectorView<spirv_cross::Instruction>.buffer_size;
  if (sVar5 != 0) {
    instruction = (block->ops).super_VectorView<spirv_cross::Instruction>.ptr;
    lVar7 = sVar5 * 0xc;
    do {
      TVar6 = handle_instruction_precision(this,instruction);
      (*(this->super_Compiler)._vptr_Compiler[8])(this,instruction);
      if (TVar6.dst_id != 0) {
        local_80.super_VectorView<unsigned_int>.buffer_size = 0;
        local_80.buffer_capacity = 8;
        local_90[0] = 0x53;
        local_90[1] = 0;
        local_90[2] = 3;
        local_80.super_VectorView<unsigned_int>.ptr = (uint *)&local_80.stack_storage;
        local_48 = TVar6;
        uVar3 = Compiler::expression_type_id(&this->super_Compiler,TVar6.src_id);
        SmallVector<unsigned_int,_8UL>::reserve
                  (&local_80,local_80.super_VectorView<unsigned_int>.buffer_size + 1);
        *(uint32_t *)
         ((char *)local_80.super_VectorView<unsigned_int>.ptr +
         local_80.super_VectorView<unsigned_int>.buffer_size * 4) = uVar3;
        sVar5 = local_80.super_VectorView<unsigned_int>.buffer_size + 2;
        local_80.super_VectorView<unsigned_int>.buffer_size =
             local_80.super_VectorView<unsigned_int>.buffer_size + 1;
        SmallVector<unsigned_int,_8UL>::reserve(&local_80,sVar5);
        *(uint32_t *)
         ((char *)local_80.super_VectorView<unsigned_int>.ptr +
         local_80.super_VectorView<unsigned_int>.buffer_size * 4) = local_48.dst_id;
        sVar5 = local_80.super_VectorView<unsigned_int>.buffer_size + 2;
        local_80.super_VectorView<unsigned_int>.buffer_size =
             local_80.super_VectorView<unsigned_int>.buffer_size + 1;
        SmallVector<unsigned_int,_8UL>::reserve(&local_80,sVar5);
        *(uint32_t *)
         ((char *)local_80.super_VectorView<unsigned_int>.ptr +
         local_80.super_VectorView<unsigned_int>.buffer_size * 4) = TVar6.src_id;
        local_80.super_VectorView<unsigned_int>.buffer_size =
             local_80.super_VectorView<unsigned_int>.buffer_size + 1;
        this->block_temporary_hoisting = true;
        (*(this->super_Compiler)._vptr_Compiler[8])(this,local_90);
        this->block_temporary_hoisting = false;
        local_80.super_VectorView<unsigned_int>.buffer_size = 0;
        if ((AlignedBuffer<unsigned_int,_8UL> *)local_80.super_VectorView<unsigned_int>.ptr !=
            &local_80.stack_storage) {
          free(local_80.super_VectorView<unsigned_int>.ptr);
        }
      }
      instruction = instruction + 1;
      lVar7 = lVar7 + -0xc;
    } while (lVar7 != 0);
  }
  this->current_emitting_block = (SPIRBlock *)0x0;
  return;
}

Assistant:

void CompilerGLSL::emit_block_instructions(SPIRBlock &block)
{
	current_emitting_block = &block;

	if (backend.requires_relaxed_precision_analysis)
	{
		// If PHI variables are consumed in unexpected precision contexts, copy them here.
		for (size_t i = 0, n = block.phi_variables.size(); i < n; i++)
		{
			auto &phi = block.phi_variables[i];

			// Ensure we only copy once. We know a-priori that this array will lay out
			// the same function variables together.
			if (i && block.phi_variables[i - 1].function_variable == phi.function_variable)
				continue;

			auto itr = temporary_to_mirror_precision_alias.find(phi.function_variable);
			if (itr != temporary_to_mirror_precision_alias.end())
			{
				// Explicitly, we don't want to inherit RelaxedPrecision state in this CopyObject,
				// so it helps to have handle_instruction_precision() on the outside of emit_instruction().
				EmbeddedInstruction inst;
				inst.op = OpCopyObject;
				inst.length = 3;
				inst.ops.push_back(expression_type_id(itr->first));
				inst.ops.push_back(itr->second);
				inst.ops.push_back(itr->first);
				emit_instruction(inst);
			}
		}
	}

	for (auto &op : block.ops)
	{
		auto temporary_copy = handle_instruction_precision(op);
		emit_instruction(op);
		if (temporary_copy.dst_id)
		{
			// Explicitly, we don't want to inherit RelaxedPrecision state in this CopyObject,
			// so it helps to have handle_instruction_precision() on the outside of emit_instruction().
			EmbeddedInstruction inst;
			inst.op = OpCopyObject;
			inst.length = 3;
			inst.ops.push_back(expression_type_id(temporary_copy.src_id));
			inst.ops.push_back(temporary_copy.dst_id);
			inst.ops.push_back(temporary_copy.src_id);

			// Never attempt to hoist mirrored temporaries.
			// They are hoisted in lock-step with their parents.
			block_temporary_hoisting = true;
			emit_instruction(inst);
			block_temporary_hoisting = false;
		}
	}

	current_emitting_block = nullptr;
}